

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.h
# Opt level: O0

void __thiscall CTeeRenderInfo::CTeeRenderInfo(CTeeRenderInfo *this)

{
  CTextureHandle *in_RDI;
  long in_FS_OFFSET;
  int i;
  vector4_base<float> *local_50;
  CTextureHandle *local_30;
  int local_24;
  vector4_base<float> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_RDI;
  do {
    IGraphics::CTextureHandle::CTextureHandle(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != in_RDI + 6);
  IGraphics::CTextureHandle::CTextureHandle(in_RDI + 6);
  IGraphics::CTextureHandle::CTextureHandle(in_RDI + 7);
  vector4_base<float>::vector4_base((vector4_base<float> *)(in_RDI + 9));
  local_50 = (vector4_base<float> *)(in_RDI + 0xd);
  do {
    vector4_base<float>::vector4_base(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (vector4_base<float> *)(in_RDI + 0x25));
  for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
    vector4_base<float>::vector4_base(&local_18,1.0,1.0,1.0,1.0);
    *(undefined8 *)(in_RDI + (long)local_24 * 4 + 0xd) = local_18._0_8_;
    *(undefined8 *)(in_RDI + (long)local_24 * 4 + 0xd + 2) = local_18._8_8_;
  }
  in_RDI[0x25].m_Id = 0x3f800000;
  in_RDI[0x26].m_Id = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTeeRenderInfo()
	{
		for(int i = 0; i < NUM_SKINPARTS; i++)
			m_aColors[i] = vec4(1,1,1,1);
		m_Size = 1.0f;
		m_GotAirJump = 1;
	}